

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
fmt::v6::to_string<char,250ul>(basic_memory_buffer<char,_250UL,_std::allocator<char>_> *buf)

{
  char *pcVar1;
  size_t sVar2;
  buffer<char> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator local_11;
  buffer<char> *local_10;
  
  local_10 = in_RSI;
  pcVar1 = internal::buffer<char>::data(in_RSI);
  sVar2 = internal::buffer<char>::size(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,sVar2,&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  return in_RDI;
}

Assistant:

std::basic_string<Char> to_string(const basic_memory_buffer<Char, SIZE>& buf) {
  return std::basic_string<Char>(buf.data(), buf.size());
}